

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O3

Parsekey __thiscall
free_format_parser::HMpsFF::checkFirstWord
          (HMpsFF *this,string *strline,size_t *start,size_t *end,string *word)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  Parsekey PVar5;
  Parsekey PVar6;
  string upper_word;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  sVar4 = std::__cxx11::string::find_first_not_of((char *)strline,0x3beeb5,0);
  *start = sVar4;
  sVar4 = sVar4 + 1;
  if (sVar4 != strline->_M_string_length) {
    bVar2 = is_empty((strline->_M_dataplus)._M_p[sVar4],&default_non_chars_abi_cxx11_);
    sVar4 = *start + 1;
    if (!bVar2) {
      sVar4 = first_word_end(strline,sVar4);
      *end = sVar4;
      std::__cxx11::string::substr((ulong)local_70,(ulong)strline);
      std::__cxx11::string::operator=((string *)word,(string *)local_70);
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      pcVar1 = (word->_M_dataplus)._M_p;
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,pcVar1,pcVar1 + word->_M_string_length);
      toupper((int)(string *)local_70);
      iVar3 = std::__cxx11::string::compare((char *)local_70);
      if (((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)local_70), iVar3 == 0)) ||
         (iVar3 = std::__cxx11::string::compare((char *)local_70), iVar3 == 0)) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)strline);
        std::__cxx11::string::operator=((string *)&this->section_args,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
      }
      iVar3 = std::__cxx11::string::compare((char *)local_70);
      if (iVar3 == 0) {
        PVar5 = kName;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)local_70);
        if (iVar3 == 0) {
          PVar5 = kObjsense;
        }
        else {
          std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
          iVar3 = std::__cxx11::string::compare((char *)local_50);
          if (local_50[0] != local_40) {
            operator_delete(local_50[0]);
          }
          if (iVar3 == 0) {
            PVar6 = kMax;
          }
          else {
            std::__cxx11::string::substr((ulong)local_50,(ulong)local_70);
            iVar3 = std::__cxx11::string::compare((char *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            if (iVar3 == 0) {
              PVar6 = kMin;
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)local_70);
              if (iVar3 == 0) {
                PVar6 = kRows;
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)local_70);
                if (iVar3 == 0) {
                  PVar6 = kCols;
                }
                else {
                  iVar3 = std::__cxx11::string::compare((char *)local_70);
                  if (iVar3 == 0) {
                    PVar6 = kRhs;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare((char *)local_70);
                    if (iVar3 == 0) {
                      PVar6 = kBounds;
                    }
                    else {
                      iVar3 = std::__cxx11::string::compare((char *)local_70);
                      if (iVar3 == 0) {
                        PVar6 = kRanges;
                      }
                      else {
                        iVar3 = std::__cxx11::string::compare((char *)local_70);
                        if (iVar3 == 0) {
                          PVar5 = kQsection;
                          goto LAB_001f98ea;
                        }
                        iVar3 = std::__cxx11::string::compare((char *)local_70);
                        if (iVar3 == 0) {
                          PVar6 = kQmatrix;
                        }
                        else {
                          iVar3 = std::__cxx11::string::compare((char *)local_70);
                          if (iVar3 == 0) {
                            PVar6 = kQuadobj;
                          }
                          else {
                            iVar3 = std::__cxx11::string::compare((char *)local_70);
                            if (iVar3 == 0) {
                              PVar5 = kQcmatrix;
                              goto LAB_001f98ea;
                            }
                            iVar3 = std::__cxx11::string::compare((char *)local_70);
                            if (iVar3 == 0) {
                              PVar6 = kCsection;
                            }
                            else {
                              iVar3 = std::__cxx11::string::compare((char *)local_70);
                              if (iVar3 == 0) {
                                PVar6 = kDelayedrows;
                              }
                              else {
                                iVar3 = std::__cxx11::string::compare((char *)local_70);
                                if (iVar3 == 0) {
                                  PVar6 = kModelcuts;
                                }
                                else {
                                  iVar3 = std::__cxx11::string::compare((char *)local_70);
                                  if (iVar3 == 0) {
                                    PVar6 = kUsercuts;
                                  }
                                  else {
                                    iVar3 = std::__cxx11::string::compare((char *)local_70);
                                    if (iVar3 == 0) {
                                      PVar6 = kIndicators;
                                    }
                                    else {
                                      iVar3 = std::__cxx11::string::compare((char *)local_70);
                                      if (iVar3 == 0) {
                                        PVar6 = kSets;
                                      }
                                      else {
                                        iVar3 = std::__cxx11::string::compare((char *)local_70);
                                        if (iVar3 == 0) {
                                          PVar6 = kSos;
                                        }
                                        else {
                                          iVar3 = std::__cxx11::string::compare((char *)local_70);
                                          if (iVar3 == 0) {
                                            PVar6 = kGencons;
                                          }
                                          else {
                                            iVar3 = std::__cxx11::string::compare((char *)local_70);
                                            if (iVar3 == 0) {
                                              PVar6 = kPwlobj;
                                            }
                                            else {
                                              iVar3 = std::__cxx11::string::compare
                                                                ((char *)local_70);
                                              if (iVar3 == 0) {
                                                PVar6 = kPwlnam;
                                              }
                                              else {
                                                iVar3 = std::__cxx11::string::compare
                                                                  ((char *)local_70);
                                                if (iVar3 == 0) {
                                                  PVar6 = kPwlcon;
                                                }
                                                else {
                                                  iVar3 = std::__cxx11::string::compare
                                                                    ((char *)local_70);
                                                  PVar5 = kNone;
                                                  if (iVar3 != 0) goto LAB_001f98ea;
                                                  PVar6 = kEnd;
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          bVar2 = is_end(strline,*end,&default_non_chars_abi_cxx11_);
          PVar5 = kNone;
          if (bVar2) {
            PVar5 = PVar6;
          }
        }
      }
LAB_001f98ea:
      if (local_70[0] == local_60) {
        return PVar5;
      }
      operator_delete(local_70[0]);
      return PVar5;
    }
  }
  *end = sVar4;
  std::__cxx11::string::_M_replace_aux((ulong)word,0,word->_M_string_length,'\x01');
  return kNone;
}

Assistant:

HMpsFF::Parsekey HMpsFF::checkFirstWord(std::string& strline, size_t& start,
                                        size_t& end, std::string& word) const {
  start = strline.find_first_not_of(" ");
  if ((start + 1 == strline.size()) || is_empty(strline[start + 1])) {
    end = start + 1;
    word = strline[start];
    return HMpsFF::Parsekey::kNone;
  }

  end = first_word_end(strline, start + 1);

  word = strline.substr(start, end - start);

  // Create an upper-case version of WORD, so that keywords are
  // read as if they were in lower or mixed case
  std::string upper_word = word;
  toupper(upper_word);

  // store rest of strline for keywords that have arguments
  if (upper_word == "QCMATRIX" || upper_word == "QSECTION" ||
      upper_word == "CSECTION")
    section_args = strline.substr(end, strline.length());

  HMpsFF::Parsekey key;

  if (upper_word == "NAME")
    key = HMpsFF::Parsekey::kName;
  else if (upper_word == "OBJSENSE")
    key = HMpsFF::Parsekey::kObjsense;
  else if (upper_word.substr(0, 3) == "MAX")
    key = HMpsFF::Parsekey::kMax;
  else if (upper_word.substr(0, 3) == "MIN")
    key = HMpsFF::Parsekey::kMin;
  else if (upper_word == "ROWS")
    key = HMpsFF::Parsekey::kRows;
  else if (upper_word == "COLUMNS")
    key = HMpsFF::Parsekey::kCols;
  else if (upper_word == "RHS")
    key = HMpsFF::Parsekey::kRhs;
  else if (upper_word == "BOUNDS")
    key = HMpsFF::Parsekey::kBounds;
  else if (upper_word == "RANGES")
    key = HMpsFF::Parsekey::kRanges;
  else if (upper_word == "QSECTION")
    key = HMpsFF::Parsekey::kQsection;
  else if (upper_word == "QMATRIX")
    key = HMpsFF::Parsekey::kQmatrix;
  else if (upper_word == "QUADOBJ")
    key = HMpsFF::Parsekey::kQuadobj;
  else if (upper_word == "QCMATRIX")
    key = HMpsFF::Parsekey::kQcmatrix;
  else if (upper_word == "CSECTION")
    key = HMpsFF::Parsekey::kCsection;
  else if (upper_word == "DELAYEDROWS")
    key = HMpsFF::Parsekey::kDelayedrows;
  else if (upper_word == "MODELCUTS")
    key = HMpsFF::Parsekey::kModelcuts;
  else if (upper_word == "USERCUTS")
    key = HMpsFF::Parsekey::kUsercuts;
  else if (upper_word == "INDICATORS")
    key = HMpsFF::Parsekey::kIndicators;
  else if (upper_word == "SETS")
    key = HMpsFF::Parsekey::kSets;
  else if (upper_word == "SOS")
    key = HMpsFF::Parsekey::kSos;
  else if (upper_word == "GENCONS")
    key = HMpsFF::Parsekey::kGencons;
  else if (upper_word == "PWLOBJ")
    key = HMpsFF::Parsekey::kPwlobj;
  else if (upper_word == "PWLNAM")
    key = HMpsFF::Parsekey::kPwlnam;
  else if (upper_word == "PWLCON")
    key = HMpsFF::Parsekey::kPwlcon;
  else if (upper_word == "ENDATA")
    key = HMpsFF::Parsekey::kEnd;
  else
    return HMpsFF::Parsekey::kNone;
  // Can have keywords used as column names or names of RHS, BOUND,
  // RANGES etc, so assume this if there are non-blanks after the
  // apparent keyword. Only cases that don't work are NAME, OBJSENSE,
  // QCMATRIX and QSECTION, since they can be followed by text
  if (key == HMpsFF::Parsekey::kName || key == HMpsFF::Parsekey::kObjsense ||
      key == HMpsFF::Parsekey::kQcmatrix || key == HMpsFF::Parsekey::kQsection)
    return key;
  assert(key != HMpsFF::Parsekey::kNone);

  if (is_end(strline, end)) return key;

  return HMpsFF::Parsekey::kNone;
}